

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void cmServer::reportMessage(char *msg,char *title,bool *param_3,void *data)

{
  undefined8 this;
  allocator local_81;
  string local_80;
  undefined1 local_50 [8];
  string titleString;
  cmServerRequest *request;
  void *data_local;
  bool *param_2_local;
  char *title_local;
  char *msg_local;
  
  titleString.field_2._8_8_ = data;
  if (data == (void *)0x0) {
    __assert_fail("request",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                  ,0xa4,
                  "static void cmServer::reportMessage(const char *, const char *, bool &, void *)")
    ;
  }
  if (msg != (char *)0x0) {
    std::__cxx11::string::string((string *)local_50);
    if (title != (char *)0x0) {
      std::__cxx11::string::operator=((string *)local_50,title);
    }
    this = titleString.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,msg,&local_81);
    cmServerRequest::ReportMessage((cmServerRequest *)this,&local_80,(string *)local_50);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string((string *)local_50);
    return;
  }
  __assert_fail("msg",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                ,0xa5,
                "static void cmServer::reportMessage(const char *, const char *, bool &, void *)");
}

Assistant:

void cmServer::reportMessage(const char* msg, const char* title,
                             bool& /* cancel */, void* data)
{
  const cmServerRequest* request = static_cast<const cmServerRequest*>(data);
  assert(request);
  assert(msg);
  std::string titleString;
  if (title) {
    titleString = title;
  }
  request->ReportMessage(std::string(msg), titleString);
}